

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O1

bool __thiscall Fossilize::ZipDatabase::prepare(ZipDatabase *this)

{
  mz_zip_archive *pZip;
  mz_bool mVar1;
  mz_uint mVar2;
  int iVar3;
  LogLevel LVar4;
  size_t sVar5;
  ulong uVar6;
  ResourceTag tag;
  mz_uint file_index;
  long lVar7;
  byte *pbVar8;
  bool bVar9;
  uint64_t value;
  char filename [512];
  mz_zip_archive_file_stat s;
  ulonglong local_6e0;
  mz_uint local_6d8 [2];
  mz_uint64 local_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined1 local_6b8;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined1 local_698;
  byte local_688;
  byte local_687 [7];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  mz_zip_archive_file_stat local_488;
  
  if (this->mode != OverWrite) {
    pZip = &this->mz;
    mVar1 = mz_zip_reader_init_file(pZip,(this->path)._M_dataplus._M_p,0);
    if (mVar1 != 0) {
      mVar2 = mz_zip_reader_get_num_files(pZip);
      memset(&local_688,0,0x200);
      if (mVar2 != 0) {
        file_index = 0;
        do {
          if ((shutdown_requested & 1) != 0) {
            return false;
          }
          mVar1 = mz_zip_reader_is_file_a_directory(pZip,file_index);
          if (mVar1 == 0) {
            mz_zip_reader_get_filename(pZip,file_index,(char *)&local_688,0x200);
            sVar5 = strlen((char *)&local_688);
            if (sVar5 == 0x28) {
              bVar9 = local_688 == 0;
              if ((!bVar9) && (iVar3 = isxdigit((uint)local_688), iVar3 != 0)) {
                pbVar8 = local_687;
                do {
                  bVar9 = *pbVar8 == 0;
                  if (bVar9) break;
                  iVar3 = isxdigit((uint)*pbVar8);
                  pbVar8 = pbVar8 + 1;
                } while (iVar3 != 0);
              }
              if ((bVar9) &&
                 (mVar1 = mz_zip_reader_file_stat(pZip,file_index,&local_488), mVar1 != 0)) {
                local_698 = 0;
                local_6a8 = local_680;
                uStack_6a0 = uStack_678;
                local_6b8 = 0;
                local_6c8 = local_670;
                uStack_6c0 = uStack_668;
                uVar6 = strtoul((char *)&local_6a8,(char **)0x0,0x10);
                tag = (ResourceTag)uVar6;
                if (tag < RESOURCE_COUNT) {
                  local_6e0 = strtoull((char *)&local_6c8,(char **)0x0,0x10);
                  bVar9 = DatabaseInterface::test_resource_filter
                                    (&this->super_DatabaseInterface,tag,local_6e0);
                  if (bVar9) {
                    local_6d0 = local_488.m_uncomp_size;
                    local_6d8[0] = file_index;
                    std::
                    _Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::_M_emplace<unsigned_long&,Fossilize::ZipDatabase::Entry>
                              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>,std::allocator<std::pair<unsigned_long_const,Fossilize::ZipDatabase::Entry>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)(this->seen_blobs +
                                  (tag & (RESOURCE_APPLICATION_BLOB_LINK|RESOURCE_COMPUTE_PIPELINE))
                                  ),&local_6e0,local_6d8);
                  }
                }
              }
            }
          }
          file_index = file_index + 1;
        } while (file_index != mVar2);
      }
      mVar1 = mz_zip_writer_init_from_reader(pZip,(this->path)._M_dataplus._M_p);
      if (mVar1 == 0) {
        LVar4 = get_thread_log_level();
        if (((int)LVar4 < 3) &&
           (bVar9 = Internal::log_thread_callback
                              (LOG_ERROR,"Failed to initialize ZIP writer from reader.\n"), !bVar9))
        {
          prepare();
        }
        mz_zip_end(pZip);
        return false;
      }
      this->alive = true;
      return true;
    }
  }
  if (this->mode == ReadOnly) {
    return true;
  }
  mVar1 = mz_zip_writer_init_file(&this->mz,(this->path)._M_dataplus._M_p,0);
  if (mVar1 == 0) {
    LVar4 = get_thread_log_level();
    if ((int)LVar4 < 3) {
      bVar9 = Internal::log_thread_callback
                        (LOG_ERROR,
                         "Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n"
                        );
      if (bVar9) {
        return false;
      }
      prepare();
    }
    return false;
  }
  this->alive = true;
  lVar7 = 0xa0;
  do {
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>,_std::allocator<std::pair<const_unsigned_long,_Fossilize::ZipDatabase::Entry>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)((long)&(this->super_DatabaseInterface)._vptr_DatabaseInterface + lVar7));
    lVar7 = lVar7 + 0x38;
  } while (lVar7 != 0x2d0);
  return true;
}

Assistant:

bool prepare() override
	{
		if (mode != DatabaseMode::OverWrite && mz_zip_reader_init_file(&mz, path.c_str(), 0))
		{
			// We have an existing archive.
			unsigned files = mz_zip_reader_get_num_files(&mz);
			char filename[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE] = {};

			for (unsigned i = 0; i < files; i++)
			{
				if (shutdown_requested.load(std::memory_order_relaxed))
					return false;

				if (mz_zip_reader_is_file_a_directory(&mz, i))
					continue;

				mz_zip_reader_get_filename(&mz, i, filename, sizeof(filename));
				size_t len = strlen(filename);
				if (len != FOSSILIZE_BLOB_HASH_LENGTH)
					continue;

				if (!string_is_hex(filename))
					continue;

				mz_zip_archive_file_stat s;
				if (!mz_zip_reader_file_stat(&mz, i, &s))
					continue;

				char tag_str[16 + 1] = {};
				char value_str[16 + 1] = {};
				memcpy(tag_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 32, 16);
				memcpy(value_str, filename + FOSSILIZE_BLOB_HASH_LENGTH - 16, 16);

				auto tag = unsigned(strtoul(tag_str, nullptr, 16));
				if (tag >= RESOURCE_COUNT)
					continue;
				uint64_t value = strtoull(value_str, nullptr, 16);

				if (test_resource_filter(static_cast<ResourceTag>(tag), value))
					seen_blobs[tag].emplace(value, Entry{i, size_t(s.m_uncomp_size)});
			}

			// In-place update the archive. Should we consider emitting a new archive instead?
			if (!mz_zip_writer_init_from_reader(&mz, path.c_str()))
			{
				LOGE_LEVEL("Failed to initialize ZIP writer from reader.\n");
				mz_zip_end(&mz);
				return false;
			}

			alive = true;
		}
		else if (mode != DatabaseMode::ReadOnly)
		{
			if (!mz_zip_writer_init_file(&mz, path.c_str(), 0))
			{
				LOGE_LEVEL("Failed to open ZIP archive for writing. Cannot serialize anything to disk.\n");
				return false;
			}

			alive = true;

			for (auto &blob : seen_blobs)
				blob.clear();
		}

		return true;
	}